

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

bool ggml_graph_compute_helper(ggml_backend_sched_t sched,ggml_cgraph *graph,int n_threads)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  code *pcVar4;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  bool t;
  _func_void_ggml_backend_t_int *fn_set_n_threads;
  ggml_backend_reg_t reg;
  ggml_backend_dev_t dev;
  ggml_backend_t backend;
  int i;
  undefined8 local_48;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    iVar1 = ggml_backend_sched_get_n_backends(in_RDI);
    if (iVar1 <= local_18) break;
    uVar2 = ggml_backend_sched_get_backend(in_RDI,local_18);
    lVar3 = ggml_backend_get_device(uVar2);
    if (lVar3 == 0) {
      local_48 = 0;
    }
    else {
      local_48 = ggml_backend_dev_backend_reg(lVar3);
    }
    pcVar4 = (code *)ggml_backend_reg_get_proc_address(local_48,"ggml_backend_set_n_threads");
    if (pcVar4 != (code *)0x0) {
      (*pcVar4)(uVar2,in_EDX);
    }
    local_18 = local_18 + 1;
  }
  iVar1 = ggml_backend_sched_graph_compute(in_RDI,in_RSI);
  ggml_backend_sched_reset(in_RDI);
  return iVar1 == 0;
}

Assistant:

static bool ggml_graph_compute_helper(
      ggml_backend_sched_t   sched,
        struct ggml_cgraph * graph,
                       int   n_threads) {

    for (int i = 0; i < ggml_backend_sched_get_n_backends(sched); ++i) {
        ggml_backend_t backend = ggml_backend_sched_get_backend(sched, i);
        ggml_backend_dev_t dev = ggml_backend_get_device(backend);
        ggml_backend_reg_t reg = dev ? ggml_backend_dev_backend_reg(dev) : nullptr;

        auto * fn_set_n_threads = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
        if (fn_set_n_threads) {
            fn_set_n_threads(backend, n_threads);
        }
    }

    bool t = ggml_backend_sched_graph_compute(sched, graph) == GGML_STATUS_SUCCESS;
    ggml_backend_sched_reset(sched);
    return t;
}